

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_dep_remove(nghttp2_stream *stream)

{
  nghttp2_stream *stream_00;
  int32_t iVar1;
  int iVar2;
  int local_2c;
  int rv;
  int32_t sum_dep_weight_delta;
  nghttp2_stream *si;
  nghttp2_stream *dep_prev;
  nghttp2_stream *stream_local;
  
  local_2c = -stream->weight;
  _rv = stream->dep_next;
  while( true ) {
    if (_rv == (nghttp2_stream *)0x0) {
      if (stream->dep_prev != (nghttp2_stream *)0x0) {
        stream_00 = stream->dep_prev;
        stream_00->sum_dep_weight = local_2c + stream_00->sum_dep_weight;
        if (stream->queued != '\0') {
          stream_obq_remove(stream);
        }
        if (stream->sib_prev == (nghttp2_stream *)0x0) {
          unlink_dep(stream);
        }
        else {
          unlink_sib(stream);
        }
        stream->sum_dep_weight = 0;
        stream->dep_prev = (nghttp2_stream *)0x0;
        stream->dep_next = (nghttp2_stream *)0x0;
        stream->sib_prev = (nghttp2_stream *)0x0;
        stream->sib_next = (nghttp2_stream *)0x0;
        validate_tree(stream_00);
        return 0;
      }
      __assert_fail("stream->dep_prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                    ,0x31a,"int nghttp2_stream_dep_remove(nghttp2_stream *)");
    }
    iVar1 = nghttp2_stream_dep_distributed_weight(stream,_rv->weight);
    _rv->weight = iVar1;
    local_2c = _rv->weight + local_2c;
    if ((_rv->queued != '\0') && (iVar2 = stream_obq_move(stream->dep_prev,stream,_rv), iVar2 != 0))
    break;
    _rv = _rv->sib_next;
  }
  return iVar2;
}

Assistant:

int nghttp2_stream_dep_remove(nghttp2_stream *stream) {
  nghttp2_stream *dep_prev, *si;
  int32_t sum_dep_weight_delta;
  int rv;

  DEBUGF("stream: dep_remove stream(%p)=%d\n", stream, stream->stream_id);

  /* Distribute weight of |stream| to direct descendants */
  sum_dep_weight_delta = -stream->weight;

  for (si = stream->dep_next; si; si = si->sib_next) {
    si->weight = nghttp2_stream_dep_distributed_weight(stream, si->weight);

    sum_dep_weight_delta += si->weight;

    if (si->queued) {
      rv = stream_obq_move(stream->dep_prev, stream, si);
      if (rv != 0) {
        return rv;
      }
    }
  }

  assert(stream->dep_prev);

  dep_prev = stream->dep_prev;

  dep_prev->sum_dep_weight += sum_dep_weight_delta;

  if (stream->queued) {
    stream_obq_remove(stream);
  }

  if (stream->sib_prev) {
    unlink_sib(stream);
  } else {
    unlink_dep(stream);
  }

  stream->sum_dep_weight = 0;

  stream->dep_prev = NULL;
  stream->dep_next = NULL;
  stream->sib_prev = NULL;
  stream->sib_next = NULL;

  validate_tree(dep_prev);

  return 0;
}